

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

const_iterator __thiscall
solitaire::Solitaire::initializeTableauPilesAndReturnFirstNotUsedCard(Solitaire *this,Deck *deck)

{
  uint __n;
  element_type *peVar1;
  const_iterator local_50;
  const_iterator firstPileCard;
  value_type *pile;
  iterator __end1;
  iterator __begin1;
  TableauPiles *__range1;
  const_iterator pvStack_20;
  uint currentPileCardsCount;
  const_iterator firstNotUsedCard;
  Deck *deck_local;
  Solitaire *this_local;
  
  firstNotUsedCard = deck->_M_elems;
  deck_local = (Deck *)this;
  pvStack_20 = std::array<solitaire::cards::Card,_52UL>::begin(deck);
  __range1._4_4_ = 1;
  __begin1 = (this->tableauPiles)._M_elems;
  __end1 = std::array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL>::begin
                     ((array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL> *)
                      __begin1);
  pile = std::array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL>::end
                   ((array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL> *)
                    __begin1);
  for (; __n = __range1._4_4_, __end1 != pile; __end1 = __end1 + 1) {
    firstPileCard = (const_iterator)__end1;
    local_50 = pvStack_20;
    __range1._4_4_ = __range1._4_4_ + 1;
    std::advance<solitaire::cards::Card_const*,unsigned_int>(&stack0xffffffffffffffe0,__n);
    peVar1 = std::
             __shared_ptr_access<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)firstPileCard);
    (*(peVar1->super_Archiver)._vptr_Archiver[3])(peVar1,&local_50,&stack0xffffffffffffffe0);
  }
  return pvStack_20;
}

Assistant:

Deck::const_iterator
Solitaire::initializeTableauPilesAndReturnFirstNotUsedCard(const Deck& deck) {
    auto firstNotUsedCard = deck.begin();
    unsigned currentPileCardsCount = 1;

    for (auto& pile: tableauPiles) {
        const auto firstPileCard = firstNotUsedCard;
        std::advance(firstNotUsedCard, currentPileCardsCount++);
        pile->initialize(firstPileCard, firstNotUsedCard);
    }

    return firstNotUsedCard;
}